

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_argb.cc
# Opt level: O0

int ARGBCopy(uint8_t *src_argb,int src_stride_argb,uint8_t *dst_argb,int dst_stride_argb,int width,
            int height)

{
  long in_RDX;
  int in_ESI;
  uint8_t *in_RDI;
  int in_R8D;
  int in_R9D;
  uint8_t *unaff_retaddr;
  int in_stack_ffffffffffffffe8;
  int in_stack_fffffffffffffffc;
  int iVar1;
  
  if ((((in_RDI == (uint8_t *)0x0) || (in_RDX == 0)) || (in_R8D < 1)) || (in_R9D == 0)) {
    iVar1 = -1;
  }
  else {
    if (in_R9D < 0) {
      in_RDI = in_RDI + (-1 - in_R9D) * in_ESI;
      in_ESI = -in_ESI;
    }
    CopyPlane(unaff_retaddr,in_stack_fffffffffffffffc,in_RDI,in_ESI,in_stack_ffffffffffffffe8,
              (int)((ulong)in_RDX >> 0x20));
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int ARGBCopy(const uint8_t* src_argb,
             int src_stride_argb,
             uint8_t* dst_argb,
             int dst_stride_argb,
             int width,
             int height) {
  if (!src_argb || !dst_argb || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_argb = src_argb + (height - 1) * src_stride_argb;
    src_stride_argb = -src_stride_argb;
  }

  CopyPlane(src_argb, src_stride_argb, dst_argb, dst_stride_argb, width * 4,
            height);
  return 0;
}